

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hacdRaycastMesh.cpp
# Opt level: O3

bool __thiscall
HACD::BBox::Raycast(BBox *this,Vec3<double> *origin,Vec3<double> *dir,Float *distMin)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double __x;
  double dVar7;
  double dVar8;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  
  dVar1 = (this->m_min).m_data[1];
  dVar2 = (this->m_max).m_data[1];
  dVar3 = (this->m_max).m_data[0];
  dVar9 = (this->m_min).m_data[0];
  dVar4 = (this->m_max).m_data[2];
  dVar5 = (this->m_min).m_data[2];
  dVar7 = dVar2 - dVar1;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = dVar3 - dVar9;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = dVar7 * dVar7;
  auVar10 = vfmadd231sd_fma(auVar19,auVar15,auVar15);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = dVar4 - dVar5;
  auVar10 = vfmadd231sd_fma(auVar10,auVar23,auVar23);
  __x = auVar10._0_8_ * 0.25;
  dVar7 = dir->m_data[1];
  dVar6 = dir->m_data[0];
  dVar8 = (dVar2 * 0.5 + dVar1 * 0.5) - origin->m_data[1];
  dVar2 = (dVar3 * 0.5 + dVar9 * 0.5) - origin->m_data[0];
  dVar3 = (dVar4 * 0.5 + dVar5 * 0.5) - origin->m_data[2];
  dVar1 = dir->m_data[2];
  dVar9 = 0.0;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = dVar8 * dVar8;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = dVar2;
  auVar10 = vfmadd231sd_fma(auVar10,auVar21,auVar21);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = dVar3;
  auVar10 = vfmadd231sd_fma(auVar10,auVar17,auVar17);
  if (__x < auVar10._0_8_) {
    auVar10 = vsqrtsd_avx(auVar10,auVar10);
    auVar24._8_8_ = 0;
    auVar24._0_8_ = __x;
    if (__x < 0.0) {
      dVar9 = sqrt(__x);
    }
    else {
      auVar15 = vsqrtsd_avx(auVar24,auVar24);
      dVar9 = auVar15._0_8_;
    }
    dVar9 = auVar10._0_8_ - dVar9;
  }
  auVar13._8_8_ = 0;
  auVar13._0_8_ = dVar1;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = dVar6;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = dVar3;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = dVar2;
  *distMin = dVar9;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = dVar8 * dVar7;
  auVar10 = vfmadd231sd_fma(auVar11,auVar20,auVar22);
  auVar10 = vfmadd231sd_fma(auVar10,auVar16,auVar13);
  dVar9 = auVar10._0_8_;
  dVar8 = dVar8 - dVar7 * dVar9;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = dVar8 * dVar8;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = dVar2 - dVar6 * dVar9;
  auVar10 = vfmadd231sd_fma(auVar12,auVar18,auVar18);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = dVar3 - dVar1 * dVar9;
  auVar10 = vfmadd231sd_fma(auVar10,auVar14,auVar14);
  return auVar10._0_8_ <= __x;
}

Assistant:

bool BBox::Raycast(const Vec3<Float> & origin, const Vec3<Float> & dir, Float & distMin) const
	{
		Vec3<Float> d = m_max - m_min;
		Float r2 = 0.25 * (d.X()*d.X()+d.Y()*d.Y()+d.Z()*d.Z());
		Vec3<Float> c = 0.5 * m_max + 0.5 * m_min;
		Vec3<Float> u = (c-origin);
		Vec3<Float> a = u - (u * dir) * dir;
		Float dist2 = (a.X()*a.X()+a.Y()*a.Y()+a.Z()*a.Z());
		distMin = (u.X()*u.X()+u.Y()*u.Y()+u.Z()*u.Z());
		if ( distMin > r2 ) // origin outside the sphere of center c and radius r 
		{
			distMin = sqrt(distMin) - sqrt(r2); // the distance to any point inside the sphere is higher than |origin - c| - r
		}
		else
		{
			distMin = 0.0;
		}
		if (dist2 > r2) return false;
		return true;
	}